

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::InitCMAKE_CONFIGURATION_TYPES(cmMakefile *this,string *genDefault)

{
  bool bVar1;
  cmake *this_00;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  string initConfigs;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  string *local_18;
  string *genDefault_local;
  cmMakefile *this_local;
  
  local_18 = genDefault;
  genDefault_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_CONFIGURATION_TYPES",&local_41);
  local_20 = GetDefinition(this,&local_40);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (!bVar1) {
    std::__cxx11::string::string((string *)local_78);
    this_00 = GetCMakeInstance(this);
    bVar1 = cmake::GetIsInTryCompile(this_00);
    if ((bVar1) ||
       (bVar1 = cmsys::SystemTools::GetEnv("CMAKE_CONFIGURATION_TYPES",(string *)local_78), !bVar1))
    {
      std::__cxx11::string::operator=((string *)local_78,(string *)local_18);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"CMAKE_CONFIGURATION_TYPES",&local_99);
    AddCacheDefinition(this,&local_98,(string *)local_78,
                       "Semicolon separated list of supported configuration types, only supports Debug, Release, MinSizeRel, and RelWithDebInfo, anything else will be ignored."
                       ,STRING,false);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    std::__cxx11::string::~string((string *)local_78);
  }
  return;
}

Assistant:

void cmMakefile::InitCMAKE_CONFIGURATION_TYPES(std::string const& genDefault)
{
  if (this->GetDefinition("CMAKE_CONFIGURATION_TYPES")) {
    return;
  }
  std::string initConfigs;
  if (this->GetCMakeInstance()->GetIsInTryCompile() ||
      !cmSystemTools::GetEnv("CMAKE_CONFIGURATION_TYPES", initConfigs)) {
    initConfigs = genDefault;
  }
  this->AddCacheDefinition(
    "CMAKE_CONFIGURATION_TYPES", initConfigs,
    "Semicolon separated list of supported configuration types, "
    "only supports Debug, Release, MinSizeRel, and RelWithDebInfo, "
    "anything else will be ignored.",
    cmStateEnums::STRING);
}